

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int mbedtls_x509_crt_parse_der_internal
              (mbedtls_x509_crt *chain,uchar *buf,size_t buflen,int make_copy,
              mbedtls_x509_crt_ext_cb_t cb,void *p_ctx)

{
  int *val;
  size_t sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  mbedtls_x509_crt *pmVar5;
  uchar *puVar6;
  size_t sVar7;
  mbedtls_x509_crt *pmVar8;
  uchar *end;
  mbedtls_x509_buf local_c8;
  size_t local_b0;
  void *local_a8;
  mbedtls_x509_crt_ext_cb_t local_a0;
  undefined1 auStack_98 [8];
  mbedtls_x509_buf sig_params2;
  undefined1 auStack_78 [8];
  mbedtls_x509_buf sig_params1;
  size_t local_48;
  size_t len;
  uchar *local_38;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crt *)0x0) {
    return -0x2800;
  }
  len = CONCAT44(len._4_4_,make_copy);
  pmVar5 = chain;
  local_a8 = p_ctx;
  local_a0 = cb;
  if (chain->version == 0) {
    pmVar8 = (mbedtls_x509_crt *)0x0;
  }
  else {
    do {
      pmVar8 = pmVar5;
      pmVar5 = pmVar8->next;
      if (pmVar5 == (mbedtls_x509_crt *)0x0) {
        pmVar5 = (mbedtls_x509_crt *)calloc(1,0x2f0);
        pmVar8->next = pmVar5;
        if (pmVar5 == (mbedtls_x509_crt *)0x0) {
          return -0x2880;
        }
        memset(pmVar5,0,0x2f0);
        pmVar5 = pmVar8->next;
        break;
      }
    } while (pmVar5->version != 0);
  }
  auStack_78 = (undefined1  [8])0x0;
  sig_params1.tag = 0;
  sig_params1._4_4_ = 0;
  sig_params1.len = 0;
  auStack_98 = (undefined1  [8])0x0;
  sig_params2.tag = 0;
  sig_params2._4_4_ = 0;
  sig_params2.len = 0;
  local_c8.tag = 0;
  local_c8._4_4_ = 0;
  local_c8.len = 0;
  local_c8.p = (uchar *)0x0;
  if (pmVar5 == (mbedtls_x509_crt *)0x0) {
    iVar3 = -0x2800;
    goto LAB_0020c75d;
  }
  local_48 = buflen;
  local_38 = buf;
  iVar2 = mbedtls_asn1_get_tag(&local_38,buf + buflen,&local_48,0x30);
  sVar1 = local_48;
  iVar3 = -0x2180;
  if (iVar2 != 0) goto LAB_0020c749;
  puVar6 = local_38 + local_48;
  sVar7 = (long)puVar6 - (long)buf;
  (pmVar5->raw).len = sVar7;
  if ((int)len == 0) {
    (pmVar5->raw).p = buf;
    pmVar5->own_buffer = 0;
  }
  else {
    puVar6 = (uchar *)calloc(1,sVar7);
    (pmVar5->raw).p = puVar6;
    if (puVar6 == (uchar *)0x0) {
      iVar3 = -0x2880;
      goto LAB_0020c75d;
    }
    len = (size_t)puVar6;
    memcpy(puVar6,buf,sVar7);
    pmVar5->own_buffer = 1;
    local_38 = (uchar *)((sVar7 - sVar1) + len);
    puVar6 = (uchar *)(len + sVar7);
  }
  (pmVar5->tbs).p = local_38;
  iVar3 = mbedtls_asn1_get_tag(&local_38,puVar6,&local_48,0x30);
  if (iVar3 != 0) goto LAB_0020c82b;
  end = local_38 + local_48;
  (pmVar5->tbs).len = (long)end - (long)(pmVar5->tbs).p;
  val = &pmVar5->version;
  len = (size_t)puVar6;
  iVar3 = mbedtls_asn1_get_tag(&local_38,end,&local_b0,0xa0);
  if (iVar3 == 0) {
    puVar6 = local_38 + local_b0;
    iVar3 = mbedtls_asn1_get_int(&local_38,puVar6,val);
    if (iVar3 != 0) {
      iVar3 = iVar3 + -0x2200;
      goto LAB_0020c8dc;
    }
    if (local_38 != puVar6) {
      iVar3 = -0x2266;
      goto LAB_0020c749;
    }
  }
  else if (iVar3 == -0x62) {
    *val = 0;
  }
  else {
    iVar3 = iVar3 + -0x2180;
LAB_0020c8dc:
    if (iVar3 != 0) goto LAB_0020c749;
  }
  iVar3 = mbedtls_x509_get_serial(&local_38,end,&pmVar5->serial);
  if (iVar3 == 0) {
    iVar3 = mbedtls_x509_get_alg(&local_38,end,&pmVar5->sig_oid,(mbedtls_x509_buf *)auStack_78);
    if (iVar3 == 0) {
      iVar3 = -0x2580;
      if ((uint)*val < 3) {
        pmVar5->version = *val + 1;
        iVar3 = mbedtls_x509_get_sig_alg
                          (&pmVar5->sig_oid,(mbedtls_x509_buf *)auStack_78,&pmVar5->sig_md,
                           &pmVar5->sig_pk,&pmVar5->sig_opts);
        if (iVar3 == 0) {
          (pmVar5->issuer_raw).p = local_38;
          iVar3 = mbedtls_asn1_get_tag(&local_38,end,&local_48,0x30);
          if (iVar3 != 0) {
LAB_0020c82b:
            mbedtls_x509_crt_free(pmVar5);
            iVar3 = iVar3 + -0x2180;
LAB_0020c83d:
            if (iVar3 == 0) {
              return 0;
            }
            goto LAB_0020c75d;
          }
          iVar3 = mbedtls_x509_get_name(&local_38,local_38 + local_48,&pmVar5->issuer);
          if (iVar3 == 0) {
            (pmVar5->issuer_raw).len = (long)local_38 - (long)(pmVar5->issuer_raw).p;
            iVar3 = x509_get_dates(&local_38,end,&pmVar5->valid_from,&pmVar5->valid_to);
            if (iVar3 == 0) {
              (pmVar5->subject_raw).p = local_38;
              iVar3 = mbedtls_asn1_get_tag(&local_38,end,&local_48,0x30);
              if (iVar3 != 0) goto LAB_0020c82b;
              if ((local_48 == 0) ||
                 (iVar3 = mbedtls_x509_get_name(&local_38,local_38 + local_48,&pmVar5->subject),
                 iVar3 == 0)) {
                (pmVar5->subject_raw).len = (long)local_38 - (long)(pmVar5->subject_raw).p;
                (pmVar5->pk_raw).p = local_38;
                iVar3 = mbedtls_pk_parse_subpubkey(&local_38,end,&pmVar5->pk);
                if (iVar3 == 0) {
                  (pmVar5->pk_raw).len = (long)local_38 - (long)(pmVar5->pk_raw).p;
                  uVar4 = pmVar5->version;
                  if ((uVar4 & 0xfffffffe) == 2) {
                    iVar3 = x509_get_uid(&local_38,end,&pmVar5->issuer_id,1);
                    if (iVar3 == 0) {
                      uVar4 = *val;
                      goto LAB_0020caac;
                    }
LAB_0020cad0:
                    mbedtls_x509_crt_free(pmVar5);
                    goto LAB_0020c83d;
                  }
LAB_0020caac:
                  if ((uVar4 & 0xfffffffe) == 2) {
                    iVar3 = x509_get_uid(&local_38,end,&pmVar5->subject_id,2);
                    if (iVar3 != 0) goto LAB_0020cad0;
                    if ((*val == 3) &&
                       (iVar3 = x509_get_crt_ext(&local_38,end,pmVar5,local_a0,local_a8), iVar3 != 0
                       )) goto LAB_0020c749;
                  }
                  iVar3 = -0x21e6;
                  if ((local_38 == end) &&
                     (iVar3 = mbedtls_x509_get_alg
                                        (&local_38,(uchar *)len,&local_c8,
                                         (mbedtls_x509_buf *)auStack_98), iVar3 == 0)) {
                    sVar7 = (pmVar5->sig_oid).len;
                    iVar3 = -0x2680;
                    if ((sVar7 == local_c8.len) &&
                       (iVar2 = bcmp((pmVar5->sig_oid).p,local_c8.p,sVar7), iVar2 == 0)) {
                      if ((auStack_78._0_4_ == auStack_98._0_4_) &&
                         (((sig_params1._0_8_ == sig_params2._0_8_ &&
                           (((sig_params1._0_8_ == 0 ||
                             (iVar2 = bcmp((void *)sig_params1.len,(void *)sig_params2.len,
                                           sig_params1._0_8_), iVar2 == 0)) &&
                            (iVar3 = mbedtls_x509_get_sig(&local_38,(uchar *)len,&pmVar5->sig),
                            iVar3 == 0)))) && (iVar3 = -0x21e6, local_38 == (uchar *)len)))) {
                        return 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0020c749:
  mbedtls_x509_crt_free(pmVar5);
LAB_0020c75d:
  if (pmVar8 != (mbedtls_x509_crt *)0x0) {
    pmVar8->next = (mbedtls_x509_crt *)0x0;
  }
  if (pmVar5 != chain) {
    free(pmVar5);
  }
  return iVar3;
}

Assistant:

static int mbedtls_x509_crt_parse_der_internal(mbedtls_x509_crt *chain,
                                               const unsigned char *buf,
                                               size_t buflen,
                                               int make_copy,
                                               mbedtls_x509_crt_ext_cb_t cb,
                                               void *p_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if (crt == NULL || buf == NULL) {
        return MBEDTLS_ERR_X509_BAD_INPUT_DATA;
    }

    while (crt->version != 0 && crt->next != NULL) {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if (crt->version != 0 && crt->next == NULL) {
        crt->next = mbedtls_calloc(1, sizeof(mbedtls_x509_crt));

        if (crt->next == NULL) {
            return MBEDTLS_ERR_X509_ALLOC_FAILED;
        }

        prev = crt;
        mbedtls_x509_crt_init(crt->next);
        crt = crt->next;
    }

    ret = x509_crt_parse_der_core(crt, buf, buflen, make_copy, cb, p_ctx);
    if (ret != 0) {
        if (prev) {
            prev->next = NULL;
        }

        if (crt != chain) {
            mbedtls_free(crt);
        }

        return ret;
    }

    return 0;
}